

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronous_factory.h
# Opt level: O3

shared_ptr<spdlog::logger> __thiscall
spdlog::synchronous_factory::
create<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
          (synchronous_factory *this,string *logger_name,color_mode *args)

{
  registry *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<spdlog::logger> sVar2;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>_> sink;
  undefined1 local_41;
  shared_ptr<spdlog::logger> local_40;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>_> local_30;
  
  local_30.
  super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,std::allocator<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>>,spdlog::color_mode&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_30.
              super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(ansicolor_stdout_sink<spdlog::details::console_nullmutex> **)&local_30,
             (allocator<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>_> *
             )&local_41,args);
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::logger,std::allocator<spdlog::logger>,std::__cxx11::string,std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(logger **)this,
             (allocator<spdlog::logger> *)&local_41,logger_name,&local_30);
  this_00 = details::registry::instance();
  local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  details::registry::initialize_logger(this_00,&local_40);
  _Var1._M_pi = extraout_RDX;
  if (local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_40.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_30.
      super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<spdlog::logger> create(std::string logger_name, SinkArgs &&...args) {
        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<spdlog::logger>(std::move(logger_name), std::move(sink));
        details::registry::instance().initialize_logger(new_logger);
        return new_logger;
    }